

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgEnc.c
# Opt level: O2

void zvgEncSetClipWin(int xMin,int yMin,int xMax,int yMax)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  
  uVar5 = xMin ^ -(ZvgENC.encFlags & 1);
  uVar6 = -(ZvgENC.encFlags & 1) ^ xMax;
  uVar2 = (int)(ZvgENC.encFlags << 0x1e) >> 0x1f;
  uVar4 = yMin ^ uVar2;
  uVar2 = uVar2 ^ yMax;
  if ((ZvgENC.encFlags & 0x10) == 0) {
    ZvgENC.xMaxClip = 599;
    if (0x256 < (int)uVar5) {
      uVar5 = 599;
    }
    iVar8 = -599;
    uVar3 = 0xfffffda8;
    if ((int)uVar5 < -599) {
      uVar5 = 0xfffffda8;
    }
    uVar7 = 0x1d7;
    if (0x1d6 < (int)uVar4) {
      uVar4 = 0x1d7;
    }
    bVar9 = SBORROW4(uVar4,-0x1d7);
    iVar1 = uVar4 + 0x1d7;
    ZvgENC.yMaxClip = 0xfffffe28;
  }
  else {
    ZvgENC.xMaxClip = 0x1ff;
    if (0x1fe < (int)uVar5) {
      uVar5 = 0x1ff;
    }
    iVar8 = -0x1ff;
    uVar3 = 0xfffffe00;
    if ((int)uVar5 < -0x1ff) {
      uVar5 = 0xfffffe00;
    }
    uVar7 = 0x17f;
    if (0x17e < (int)uVar4) {
      uVar4 = 0x17f;
    }
    bVar9 = SBORROW4(uVar4,-0x17f);
    iVar1 = uVar4 + 0x17f;
    ZvgENC.yMaxClip = 0xfffffe80;
  }
  if (bVar9 != iVar1 < 0) {
    uVar4 = ZvgENC.yMaxClip;
  }
  if ((int)uVar6 < ZvgENC.xMaxClip) {
    ZvgENC.xMaxClip = uVar6;
  }
  if (ZvgENC.xMaxClip < iVar8) {
    ZvgENC.xMaxClip = uVar3;
  }
  if ((ZvgENC.yMaxClip <= (int)uVar2) && (ZvgENC.yMaxClip = uVar7, (int)uVar2 < (int)uVar7)) {
    ZvgENC.yMaxClip = uVar2;
  }
  ZvgENC.xMinClip = ZvgENC.xMaxClip;
  if ((int)uVar5 < ZvgENC.xMaxClip) {
    ZvgENC.xMinClip = uVar5;
  }
  if (ZvgENC.xMaxClip < (int)uVar5) {
    ZvgENC.xMaxClip = uVar5;
  }
  ZvgENC.yMinClip = ZvgENC.yMaxClip;
  if ((int)uVar4 < ZvgENC.yMaxClip) {
    ZvgENC.yMinClip = uVar4;
  }
  if (ZvgENC.yMaxClip < (int)uVar4) {
    ZvgENC.yMaxClip = uVar4;
  }
  return;
}

Assistant:

void zvgEncSetClipWin( int xMin, int yMin, int xMax, int yMax)
{
	int	tSwap;

	// start by flipping window if needed

	if (ZvgENC.encFlags & ENCF_FLIPX)
	{	xMin = ~xMin;
		xMax = ~xMax;
	}

	if (ZvgENC.encFlags & ENCF_FLIPY)
	{	yMin = ~yMin;
		yMax = ~yMax;
	}

	// clip, clip window

	if (ZvgENC.encFlags & ENCF_NOOVS)
	{
		if (xMin < X_MIN)
			xMin = X_MIN;

		else if (xMin > X_MAX)
			xMin = X_MAX;

		if (yMin < Y_MIN)
			yMin = Y_MIN;

		else if (yMin > Y_MAX)
			yMin = Y_MAX;

		if (xMax < X_MIN)
			xMax = X_MIN;

		else if (xMax > X_MAX)
			xMax = X_MAX;

		if (yMax < Y_MIN)
			yMax = Y_MIN;

		else if (yMax > Y_MAX)
			yMax = Y_MAX;
	}
	else
	{		
		if (xMin < X_MIN_O)
			xMin = X_MIN_O;

		else if (xMin > X_MAX_O)
			xMin = X_MAX_O;

		if (yMin < Y_MIN_O)
			yMin = Y_MIN_O;

		else if (yMin > Y_MAX_O)
			yMin = Y_MAX_O;

		if (xMax < X_MIN_O)
			xMax = X_MIN_O;

		else if (xMax > X_MAX_O)
			xMax = X_MAX_O;

		if (yMax < Y_MIN_O)
			yMax = Y_MIN_O;

		else if (yMax > Y_MAX_O)
			yMax = Y_MAX_O;
	}

	// make sure a negative box size is not being requested

	if (xMin > xMax)
	{	tSwap = xMax;
		xMax = xMin;
		xMin = tSwap;
	}

	if (yMin > yMax)
	{	tSwap = yMax;
		yMax = yMin;
		yMin = tSwap;
	}

	// set new clip window

	ZvgENC.xMinClip = xMin;
	ZvgENC.yMinClip = yMin;
	ZvgENC.xMaxClip = xMax;
	ZvgENC.yMaxClip = yMax;
}